

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris-core.c
# Opt level: O0

MediaPlayer2 * media_player2_proxy_new_for_bus_finish(GAsyncResult *res,GError **error)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  GType GVar4;
  GObject *source_object;
  GObject *ret;
  GError **error_local;
  GAsyncResult *res_local;
  
  uVar1 = g_async_result_get_source_object(res);
  uVar2 = g_async_initable_get_type();
  uVar2 = g_type_check_instance_cast(uVar1,uVar2);
  lVar3 = g_async_initable_new_finish(uVar2,res,error);
  g_object_unref(uVar1);
  if (lVar3 == 0) {
    res_local = (GAsyncResult *)0x0;
  }
  else {
    GVar4 = media_player2_get_type();
    res_local = (GAsyncResult *)g_type_check_instance_cast(lVar3,GVar4);
  }
  return (MediaPlayer2 *)res_local;
}

Assistant:

MediaPlayer2 *
media_player2_proxy_new_for_bus_finish (
    GAsyncResult        *res,
    GError             **error)
{
  GObject *ret;
  GObject *source_object;
  source_object = g_async_result_get_source_object (res);
  ret = g_async_initable_new_finish (G_ASYNC_INITABLE (source_object), res, error);
  g_object_unref (source_object);
  if (ret != NULL)
    return MEDIA_PLAYER2 (ret);
  else
    return NULL;
}